

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp type_exception(sexp ctx,sexp self,sexp str,sexp obj,sexp src)

{
  sexp irritants;
  sexp psVar1;
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp sym;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp procedure;
  undefined8 message;
  undefined8 kind;
  undefined8 uVar2;
  
  uVar2 = &DAT_0000043e;
  memset(&stack0xffffffffffffffc0,0,0x10);
  memset(&stack0xffffffffffffffa8,0,0x10);
  message = &stack0xffffffffffffffd0;
  kind = *(undefined8 *)(in_RDI + 0x6080);
  *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffffc0;
  psVar1 = (sexp)&stack0xffffffffffffffb8;
  procedure = *(sexp *)(in_RDI + 0x6080);
  *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffffa8;
  irritants = sexp_intern(res,(char *)__sexp_gc_preserver1.next,
                          (sexp_sint_t)__sexp_gc_preserver1.var);
  uVar2 = sexp_make_exception((sexp)uVar2,(sexp)kind,(sexp)message,irritants,procedure,psVar1);
  psVar1 = sexp_cons_op((sexp)kind,(sexp)message,(sexp_sint_t)irritants,procedure,psVar1);
  (((sexp)uVar2)->value).type.slots = psVar1;
  *(undefined8 *)(in_RDI + 0x6080) = kind;
  return (sexp)uVar2;
}

Assistant:

static sexp type_exception (sexp ctx, sexp self, sexp str, sexp obj, sexp src) {
  sexp_gc_var2(res, sym);
  sexp_gc_preserve2(ctx, res, sym);
  sym = sexp_intern(ctx, "type", -1);
  res = sexp_make_exception(ctx, sym, str, obj, self, src);
  sexp_exception_irritants(res)=sexp_list1(ctx, sexp_exception_irritants(res));
  sexp_gc_release2(ctx);
  return res;
}